

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CreatePhiInstruction
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *parent_block,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *phi_operands,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *case_block_ids,
          uint32_t default_block_id)

{
  undefined8 uVar1;
  uint32_t uVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  IRContext *pIVar6;
  Instruction *pIVar7;
  DefUseManager *this_00;
  Instruction *phi;
  undefined1 local_78 [4];
  uint32_t phi_result_type_id;
  undefined1 local_70 [8];
  InstructionBuilder builder;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> incomings;
  uint32_t default_block_id_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *case_block_ids_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *phi_operands_local;
  BasicBlock *parent_block_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = default_block_id;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(case_block_ids);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(phi_operands);
  if (sVar3 + 1 != sVar4) {
    __assert_fail("case_block_ids.size() + 1 == phi_operands.size() && \"Number of Phi operands must be exactly 1 bigger than the one of case \" \"blocks\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp"
                  ,0x194,
                  "uint32_t spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CreatePhiInstruction(BasicBlock *, const std::vector<uint32_t> &, const std::vector<uint32_t> &, uint32_t) const"
                 );
  }
  builder.preserved_analyses_ = kAnalysisNone;
  builder._28_4_ = 0;
  for (; uVar1 = builder._24_8_,
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(case_block_ids),
      (ulong)uVar1 < sVar3; builder._24_8_ = builder._24_8_ + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (phi_operands,builder._24_8_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,pvVar5);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (case_block_ids,builder._24_8_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,pvVar5);
  }
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(phi_operands);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,pvVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
             (value_type_conflict *)
             ((long)&incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pIVar6 = Pass::context(&this->super_Pass);
  BasicBlock::begin((BasicBlock *)local_78);
  pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)local_78);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)local_70,pIVar6,pIVar7,
             (anonymous_namespace)::kAnalysisDefUseAndInstrToBlockMapping);
  pIVar6 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_def_use_mgr(pIVar6);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](phi_operands,0);
  pIVar7 = analysis::DefUseManager::GetDef(this_00,*pvVar5);
  uVar2 = opt::Instruction::type_id(pIVar7);
  pIVar7 = InstructionBuilder::AddPhi
                     ((InstructionBuilder *)local_70,uVar2,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
  uVar2 = opt::Instruction::result_id(pIVar7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  return uVar2;
}

Assistant:

uint32_t ReplaceDescArrayAccessUsingVarIndex::CreatePhiInstruction(
    BasicBlock* parent_block, const std::vector<uint32_t>& phi_operands,
    const std::vector<uint32_t>& case_block_ids,
    uint32_t default_block_id) const {
  std::vector<uint32_t> incomings;
  assert(case_block_ids.size() + 1 == phi_operands.size() &&
         "Number of Phi operands must be exactly 1 bigger than the one of case "
         "blocks");
  for (size_t i = 0; i < case_block_ids.size(); ++i) {
    incomings.push_back(phi_operands[i]);
    incomings.push_back(case_block_ids[i]);
  }
  incomings.push_back(phi_operands.back());
  incomings.push_back(default_block_id);

  InstructionBuilder builder{context(), &*parent_block->begin(),
                             kAnalysisDefUseAndInstrToBlockMapping};
  uint32_t phi_result_type_id =
      context()->get_def_use_mgr()->GetDef(phi_operands[0])->type_id();
  auto* phi = builder.AddPhi(phi_result_type_id, incomings);
  return phi->result_id();
}